

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void get_type_alias_name(c2m_ctx_t c2m_ctx,type *type,VARR_char *name)

{
  type_mode tVar1;
  gen_ctx_conflict *pgVar2;
  VARR_node_t *pVVar3;
  anon_union_8_5_3fbb1736_for_u aVar4;
  node_t pnVar5;
  byte *pbVar6;
  node_code_t nVar7;
  int iVar8;
  basic_type bVar9;
  node_t_conflict *__ptr;
  char *pcVar10;
  decl_spec *pdVar11;
  node_t_conflict pnVar12;
  ulong uVar13;
  ulong uVar14;
  char obj;
  size_t val;
  size_t sVar15;
  size_t sVar16;
  node_t_conflict param;
  int *piVar17;
  anon_union_8_5_3fbb1736_for_u *paVar18;
  bool bVar19;
  
  do {
    tVar1 = type->mode;
    switch(tVar1) {
    case TM_BASIC:
      goto switchD_001aac16_caseD_1;
    case TM_ENUM:
      bVar9 = get_enum_basic_type(type);
      goto LAB_001aaefa;
    case TM_PTR:
      pcVar10 = name->varr;
      if (pcVar10 == (char *)0x0) goto LAB_001ab24e;
      sVar15 = name->els_num;
      uVar13 = sVar15 + 1;
      if (name->size < uVar13) {
        sVar16 = (uVar13 >> 1) + uVar13;
        pcVar10 = (char *)realloc(pcVar10,sVar16);
        name->varr = pcVar10;
        name->size = sVar16;
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
      }
      paVar18 = &type->u;
      name->els_num = uVar13;
      pcVar10[sVar15] = 'p';
      break;
    case TM_STRUCT:
    case TM_UNION:
      pcVar10 = name->varr;
      if (pcVar10 == (char *)0x0) goto LAB_001ab281;
      sVar15 = name->els_num;
      pgVar2 = c2m_ctx->gen_ctx;
      uVar13 = sVar15 + 1;
      if (name->size < uVar13) {
        sVar16 = (uVar13 >> 1) + uVar13;
        pcVar10 = (char *)realloc(pcVar10,sVar16);
        name->varr = pcVar10;
        name->size = sVar16;
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
      }
      name->els_num = uVar13;
      pcVar10[sVar15] = (tVar1 != TM_STRUCT) * '\x02' + 'S';
      pVVar3 = pgVar2->node_stack;
      if (pVVar3 == (VARR_node_t *)0x0) goto LAB_001ab286;
      sVar15 = pVVar3->els_num;
      if (sVar15 == 0) goto LAB_001aad52;
      val = 0;
      goto LAB_001aad33;
    case TM_ARR:
      pcVar10 = name->varr;
      if (pcVar10 == (char *)0x0) goto LAB_001ab253;
      sVar15 = name->els_num;
      uVar13 = sVar15 + 1;
      if (name->size < uVar13) {
        sVar16 = (uVar13 >> 1) + uVar13;
        pcVar10 = (char *)realloc(pcVar10,sVar16);
        name->varr = pcVar10;
        name->size = sVar16;
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
      }
      name->els_num = uVar13;
      pcVar10[sVar15] = 'A';
      paVar18 = (anon_union_8_5_3fbb1736_for_u *)&((type->u).ptr_type)->arr_type;
      break;
    case TM_FUNC:
      pcVar10 = name->varr;
      if (pcVar10 != (char *)0x0) {
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
        if (name->size < uVar13) {
          sVar16 = (uVar13 >> 1) + uVar13;
          pcVar10 = (char *)realloc(pcVar10,sVar16);
          name->varr = pcVar10;
          name->size = sVar16;
          sVar15 = name->els_num;
          uVar13 = sVar15 + 1;
        }
        name->els_num = uVar13;
        pcVar10[sVar15] = 'F';
        get_type_alias_name(c2m_ctx,((type->u).ptr_type)->arr_type,name);
        pnVar12 = (type->u).tag_type;
        param = (((pnVar12->op_link).prev)->u).ops.head;
        if (param != (node_t_conflict)0x0) {
          do {
            pdVar11 = get_param_decl_spec(param);
            get_type_alias_name(c2m_ctx,pdVar11->type,name);
            param = (param->op_link).next;
          } while (param != (node_t)0x0);
          pnVar12 = (type->u).tag_type;
        }
        nVar7 = pnVar12->code;
        pcVar10 = name->varr;
        if (pcVar10 != (char *)0x0) {
          sVar15 = name->els_num;
          uVar13 = sVar15 + 1;
          if (name->size < uVar13) {
            sVar16 = (uVar13 >> 1) + uVar13;
            pcVar10 = (char *)realloc(pcVar10,sVar16);
            name->varr = pcVar10;
            name->size = sVar16;
            sVar15 = name->els_num;
            uVar13 = sVar15 + 1;
          }
          name->els_num = uVar13;
          pcVar10[sVar15] = ((nVar7 & N_I) == N_IGNORE) << 5 | 0x45;
          return;
        }
        goto LAB_001ab29a;
      }
      goto LAB_001ab295;
    default:
      goto switchD_001aac16_default;
    }
    type = paVar18->ptr_type;
  } while( true );
LAB_001ab27c:
  get_type_alias_name_cold_7();
LAB_001ab281:
  get_type_alias_name_cold_11();
LAB_001ab286:
  get_type_alias_name_cold_10();
LAB_001ab28b:
  get_type_alias_name_cold_8();
  goto LAB_001ab290;
LAB_001ab24e:
  get_type_alias_name_cold_12();
LAB_001ab253:
  get_type_alias_name_cold_3();
switchD_001aac16_default:
  __assert_fail("FALSE",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x28a7,"void get_type_alias_name(c2m_ctx_t, struct type *, VARR_char *)");
switchD_001aac16_caseD_1:
  bVar9 = (type->u).basic_type;
LAB_001aaefa:
  switch(bVar9) {
  case TP_VOID:
    obj = 'v';
    break;
  case TP_BOOL:
    obj = 'b';
    break;
  case TP_CHAR:
  case TP_SCHAR:
  case TP_UCHAR:
    pcVar10 = name->varr;
    if (pcVar10 != (char *)0x0) {
      sVar15 = name->els_num;
      uVar13 = sVar15 + 1;
      if (name->size < uVar13) {
        sVar16 = (uVar13 >> 1) + uVar13;
        pcVar10 = (char *)realloc(pcVar10,sVar16);
        name->varr = pcVar10;
        name->size = sVar16;
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
      }
      name->els_num = uVar13;
      pcVar10[sVar15] = 'c';
      return;
    }
    goto LAB_001ab2a4;
  case TP_SHORT:
  case TP_USHORT:
    pcVar10 = name->varr;
    if (pcVar10 != (char *)0x0) {
      sVar15 = name->els_num;
      uVar13 = sVar15 + 1;
      if (name->size < uVar13) {
        sVar16 = (uVar13 >> 1) + uVar13;
        pcVar10 = (char *)realloc(pcVar10,sVar16);
        name->varr = pcVar10;
        name->size = sVar16;
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
      }
      name->els_num = uVar13;
      pcVar10[sVar15] = 's';
      return;
    }
    goto LAB_001ab2a9;
  case TP_INT:
  case TP_UINT:
    pcVar10 = name->varr;
    if (pcVar10 != (char *)0x0) {
      sVar15 = name->els_num;
      uVar13 = sVar15 + 1;
      if (name->size < uVar13) {
        sVar16 = (uVar13 >> 1) + uVar13;
        pcVar10 = (char *)realloc(pcVar10,sVar16);
        name->varr = pcVar10;
        name->size = sVar16;
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
      }
      name->els_num = uVar13;
      pcVar10[sVar15] = 'i';
      return;
    }
    goto LAB_001ab2b3;
  case TP_LONG:
  case TP_ULONG:
    pcVar10 = name->varr;
    if (pcVar10 != (char *)0x0) {
      sVar15 = name->els_num;
      uVar13 = sVar15 + 1;
      if (name->size < uVar13) {
        sVar16 = (uVar13 >> 1) + uVar13;
        pcVar10 = (char *)realloc(pcVar10,sVar16);
        name->varr = pcVar10;
        name->size = sVar16;
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
      }
      name->els_num = uVar13;
      pcVar10[sVar15] = 'l';
      return;
    }
    goto LAB_001ab2b8;
  case TP_LLONG:
  case TP_ULLONG:
    pcVar10 = name->varr;
    if (pcVar10 != (char *)0x0) {
      sVar15 = name->els_num;
      uVar13 = sVar15 + 1;
      if (name->size < uVar13) {
        sVar16 = (uVar13 >> 1) + uVar13;
        pcVar10 = (char *)realloc(pcVar10,sVar16);
        name->varr = pcVar10;
        name->size = sVar16;
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
      }
      name->els_num = uVar13;
      pcVar10[sVar15] = 'L';
      return;
    }
    goto LAB_001ab2ae;
  case TP_FLOAT:
    obj = 'f';
    break;
  case TP_DOUBLE:
    obj = 'd';
    break;
  case TP_LDOUBLE:
    obj = 'D';
    break;
  default:
    goto switchD_001aaf13_default;
  }
  VARR_charpush(name,obj);
  return;
  while (val = val + 1, sVar15 != val) {
LAB_001aad33:
    if (pVVar3->varr == (node_t_conflict *)0x0) {
      get_type_alias_name_cold_5();
      goto LAB_001ab27c;
    }
    if (pVVar3->varr[val] == (type->u).tag_type) {
      pcVar10 = name->varr;
      if (pcVar10 == (char *)0x0) goto LAB_001ab29f;
      sVar15 = name->els_num;
      uVar13 = sVar15 + 1;
      if (name->size < uVar13) {
        sVar16 = (uVar13 >> 1) + uVar13;
        pcVar10 = (char *)realloc(pcVar10,sVar16);
        name->varr = pcVar10;
        name->size = sVar16;
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
      }
      name->els_num = uVar13;
      pcVar10[sVar15] = 'r';
      push_val(name,val);
      goto LAB_001ab092;
    }
  }
LAB_001aad52:
  __ptr = pVVar3->varr;
  if (__ptr != (node_t_conflict *)0x0) {
    aVar4 = type->u;
    uVar13 = sVar15 + 1;
    if (pVVar3->size < uVar13) {
      sVar15 = (uVar13 >> 1) + uVar13;
      __ptr = (node_t_conflict *)realloc(__ptr,sVar15 * 8);
      pVVar3->varr = __ptr;
      pVVar3->size = sVar15;
      sVar15 = pVVar3->els_num;
      uVar13 = sVar15 + 1;
    }
    pVVar3->els_num = uVar13;
    *(anon_union_8_5_3fbb1736_for_u *)(__ptr + sVar15) = aVar4;
    for (pnVar5 = (((((((type->u).tag_type)->u).ops.head)->op_link).next)->u).ops.head;
        pnVar5 != (node_t)0x0; pnVar5 = (pnVar5->op_link).next) {
      if (pnVar5->code == N_MEMBER) {
        piVar17 = (int *)(pnVar5->u).l;
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)0x0;
        }
        else {
          iVar8 = -2;
          do {
            piVar17 = *(int **)(piVar17 + 6);
            if (piVar17 == (int *)0x0) break;
            bVar19 = iVar8 != 0;
            iVar8 = iVar8 + 1;
          } while (bVar19);
        }
        get_type_alias_name(c2m_ctx,*(type **)((long)pnVar5->attr + 0x40),name);
        if ((*piVar17 != 0) && (pbVar6 = *(byte **)(piVar17 + 2), (*pbVar6 & 1) != 0)) {
          pcVar10 = name->varr;
          if (pcVar10 == (char *)0x0) goto LAB_001ab27c;
          sVar15 = name->els_num;
          uVar13 = sVar15 + 1;
          if (name->size < uVar13) {
            sVar16 = (uVar13 >> 1) + uVar13;
            pcVar10 = (char *)realloc(pcVar10,sVar16);
            name->varr = pcVar10;
            name->size = sVar16;
            sVar15 = name->els_num;
            uVar13 = sVar15 + 1;
          }
          name->els_num = uVar13;
          pcVar10[sVar15] = 'w';
          push_val(name,*(mir_long *)(pbVar6 + 0x30));
          uVar13 = *(ulong *)(pbVar6 + 0x30);
          do {
            pcVar10 = name->varr;
            if (pcVar10 == (char *)0x0) {
              get_type_alias_name_cold_6();
              goto LAB_001ab24e;
            }
            sVar15 = name->els_num;
            uVar14 = sVar15 + 1;
            if (name->size < uVar14) {
              sVar16 = (uVar14 >> 1) + uVar14;
              pcVar10 = (char *)realloc(pcVar10,sVar16);
              name->varr = pcVar10;
              name->size = sVar16;
              sVar15 = name->els_num;
              uVar14 = sVar15 + 1;
            }
            name->els_num = uVar14;
            pcVar10[sVar15] = (char)uVar13 + (char)(uVar13 / 10) * -10 | 0x30;
            bVar19 = 9 < uVar13;
            uVar13 = uVar13 / 10;
          } while (bVar19);
        }
      }
    }
LAB_001ab092:
    pcVar10 = name->varr;
    if (pcVar10 != (char *)0x0) {
      sVar15 = name->els_num;
      uVar13 = sVar15 + 1;
      if (name->size < uVar13) {
        sVar16 = (uVar13 >> 1) + uVar13;
        pcVar10 = (char *)realloc(pcVar10,sVar16);
        name->varr = pcVar10;
        name->size = sVar16;
        sVar15 = name->els_num;
        uVar13 = sVar15 + 1;
      }
      name->els_num = uVar13;
      pcVar10[sVar15] = 'e';
      return;
    }
    goto LAB_001ab28b;
  }
LAB_001ab290:
  get_type_alias_name_cold_9();
LAB_001ab295:
  get_type_alias_name_cold_2();
LAB_001ab29a:
  get_type_alias_name_cold_1();
LAB_001ab29f:
  get_type_alias_name_cold_4();
LAB_001ab2a4:
  get_type_alias_name_cold_17();
LAB_001ab2a9:
  get_type_alias_name_cold_16();
LAB_001ab2ae:
  get_type_alias_name_cold_13();
LAB_001ab2b3:
  get_type_alias_name_cold_15();
LAB_001ab2b8:
  get_type_alias_name_cold_14();
switchD_001aaf13_default:
  __assert_fail("FALSE",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x2874,"void get_type_alias_name(c2m_ctx_t, struct type *, VARR_char *)");
}

Assistant:

static void get_type_alias_name (c2m_ctx_t c2m_ctx, struct type *type, VARR (char) * name) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  enum basic_type basic_type;
  size_t i;

  switch (type->mode) {
  case TM_ENUM: basic_type = get_enum_basic_type (type); goto basic;
  case TM_BASIC:
    basic_type = type->u.basic_type;
  basic:
    switch (basic_type) {
    case TP_VOID: VARR_PUSH (char, name, 'v'); break;
    case TP_BOOL: VARR_PUSH (char, name, 'b'); break;
    case TP_CHAR:
    case TP_SCHAR:
    case TP_UCHAR: VARR_PUSH (char, name, 'c'); break;
    case TP_SHORT:
    case TP_USHORT: VARR_PUSH (char, name, 's'); break;
    case TP_INT:
    case TP_UINT: VARR_PUSH (char, name, 'i'); break;
    case TP_LONG:
    case TP_ULONG: VARR_PUSH (char, name, 'l'); break;
    case TP_LLONG:
    case TP_ULLONG: VARR_PUSH (char, name, 'L'); break;
    case TP_FLOAT: VARR_PUSH (char, name, 'f'); break;
    case TP_DOUBLE: VARR_PUSH (char, name, 'd'); break;
    case TP_LDOUBLE: VARR_PUSH (char, name, 'D'); break;
    default: assert (FALSE);
    }
    break;
  case TM_PTR:
    VARR_PUSH (char, name, 'p');
    get_type_alias_name (c2m_ctx, type->u.ptr_type, name);
    break;
  case TM_STRUCT:
  case TM_UNION:
    VARR_PUSH (char, name, type->mode == TM_STRUCT ? 'S' : 'U');
    for (i = 0; i < VARR_LENGTH (node_t, node_stack); i++)
      if (VARR_GET (node_t, node_stack, i) == type->u.tag_type) break;
    if (i < VARR_LENGTH (node_t, node_stack)) {
      VARR_PUSH (char, name, 'r');
      push_val (name, (mir_long) i);
    } else {
      VARR_PUSH (node_t, node_stack, type->u.tag_type);
      for (node_t member = NL_HEAD (NL_EL (type->u.tag_type->u.ops, 1)->u.ops); member != NULL;
           member = NL_NEXT (member))
        if (member->code == N_MEMBER) {
          decl_t decl = member->attr;
          node_t width = NL_EL (member->u.ops, 3);
          struct expr *expr;

          get_type_alias_name (c2m_ctx, decl->decl_spec.type, name);
          if (width->code != N_IGNORE && (expr = width->attr)->const_p) {
            VARR_PUSH (char, name, 'w');
            push_val (name, (mir_long) expr->c.u_val);
            for (mir_ullong v = expr->c.u_val;;) {
              VARR_PUSH (char, name, v % 10 + '0');
              v /= 10;
              if (v == 0) break;
            }
          }
        }
    }
    VARR_PUSH (char, name, 'e');
    break;
  case TM_ARR:
    VARR_PUSH (char, name, 'A');
    get_type_alias_name (c2m_ctx, type->u.arr_type->el_type, name);
    break;
  case TM_FUNC:
    VARR_PUSH (char, name, 'F');
    get_type_alias_name (c2m_ctx, type->u.func_type->ret_type, name);
    for (node_t p = NL_HEAD (type->u.func_type->param_list->u.ops); p != NULL; p = NL_NEXT (p)) {
      struct decl_spec *ds = get_param_decl_spec (p);
      get_type_alias_name (c2m_ctx, ds->type, name);
    }
    VARR_PUSH (char, name, type->u.func_type->dots_p ? 'E' : 'e');
    break;
  default: assert (FALSE);
  }
}